

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O2

Result * CoreML::validateRankCount
                   (Result *__return_storage_ptr__,NeuralNetworkLayer *layer,string *layerType,
                   int min,int max,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *blobNameToRank)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  bool bVar3;
  Type *pTVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  allocator<char> local_81;
  int local_80;
  int local_7c;
  string local_78;
  undefined1 local_58 [40];
  
  local_80 = min;
  local_7c = max;
  Result::Result(__return_storage_ptr__);
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(layer->input_).super_RepeatedPtrFieldBase,0);
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&blobNameToRank->_M_t,pTVar4);
  p_Var1 = &(blobNameToRank->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&(layer->input_).super_RepeatedPtrFieldBase,0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::at(blobNameToRank,pTVar4);
    iVar2 = *pmVar6;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"input",&local_81);
    checkRank((Result *)local_58,layer,layerType,local_80,local_7c,&local_78,iVar2);
    Result::operator=(__return_storage_ptr__,(Result *)local_58);
    std::__cxx11::string::~string((string *)(local_58 + 8));
    std::__cxx11::string::~string((string *)&local_78);
  }
  bVar3 = Result::good(__return_storage_ptr__);
  if (bVar3) {
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&(layer->output_).super_RepeatedPtrFieldBase,0);
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&blobNameToRank->_M_t,pTVar4);
    if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(layer->output_).super_RepeatedPtrFieldBase,0);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::at(blobNameToRank,pTVar4);
      iVar2 = *pmVar6;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"output",&local_81);
      checkRank((Result *)local_58,layer,layerType,local_80,local_7c,&local_78,iVar2);
      Result::operator=(__return_storage_ptr__,(Result *)local_58);
      std::__cxx11::string::~string((string *)(local_58 + 8));
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateRankCount(const Specification::NeuralNetworkLayer& layer,
                                const std::string &layerType, int min, int max,
                                std::map<std::string, int>& blobNameToRank) {

    Result r;

    // check that 1st input's rank is within permissible limits
    if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end()) {
        int rank = blobNameToRank.at(layer.input(0));
        r = checkRank(layer, layerType, min, max, "input", rank);
    }

    if (!r.good()) {return r;}

    // check that 2nd input's rank is within permissible limits
    if (blobNameToRank.find(layer.output(0)) != blobNameToRank.end()) {
        int rank = blobNameToRank.at(layer.output(0));
        r = checkRank(layer, layerType, min, max, "output", rank);
    }
    return r;
}